

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

char * __thiscall icu_63::Package::allocString(Package *this,UBool in,int32_t length)

{
  int local_24;
  char *pcStack_20;
  int32_t top;
  char *p;
  int32_t length_local;
  UBool in_local;
  Package *this_local;
  
  if (in == '\0') {
    local_24 = this->outStringTop;
    pcStack_20 = this->outStrings + local_24;
  }
  else {
    local_24 = this->inStringTop;
    pcStack_20 = this->inStrings + local_24;
  }
  local_24 = length + 1 + local_24;
  if (100000 < local_24) {
    fprintf(_stderr,"icupkg: string storage overflow\n");
    exit(0xf);
  }
  if (in == '\0') {
    this->outStringTop = local_24;
  }
  else {
    this->inStringTop = local_24;
  }
  return pcStack_20;
}

Assistant:

char *
Package::allocString(UBool in, int32_t length) {
    char *p;
    int32_t top;

    if(in) {
        top=inStringTop;
        p=inStrings+top;
    } else {
        top=outStringTop;
        p=outStrings+top;
    }
    top+=length+1;

    if(top>STRING_STORE_SIZE) {
        fprintf(stderr, "icupkg: string storage overflow\n");
        exit(U_BUFFER_OVERFLOW_ERROR);
    }
    if(in) {
        inStringTop=top;
    } else {
        outStringTop=top;
    }
    return p;
}